

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessWaitForPipe(cmsysProcess *cp,char **data,int *length,kwsysProcessWaitData *wd)

{
  ssize_t sVar1;
  int *piVar2;
  char *__src;
  int iVar3;
  bool bVar4;
  double *local_a8;
  fd_set *__arr;
  int iStack_60;
  uint __i;
  kwsysProcess_ssize_t n;
  kwsysProcessTimeNative *timeout;
  int max;
  int numReady;
  kwsysProcessTimeNative timeoutLength;
  int i;
  kwsysProcessWaitData *wd_local;
  int *length_local;
  char **data_local;
  cmsysProcess *cp_local;
  
  timeoutLength.tv_usec._4_4_ = 0;
  do {
    if (2 < timeoutLength.tv_usec._4_4_) {
      if (wd->PipeId == 0) {
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          (cp->PipeSet).__fds_bits[__arr._4_4_] = 0;
        }
        if ((wd->TimeoutTime).tv_sec < 0) {
          n = 0;
        }
        else {
          n = (kwsysProcess_ssize_t)&max;
        }
        if (wd->User == 0) {
          local_a8 = (double *)0x0;
        }
        else {
          local_a8 = wd->UserTimeout;
        }
        iVar3 = kwsysProcessGetTimeoutLeft
                          (&wd->TimeoutTime,local_a8,(kwsysProcessTimeNative *)&max,0);
        if (iVar3 == 0) {
          timeout._0_4_ = -1;
          for (timeoutLength.tv_usec._4_4_ = 0; timeoutLength.tv_usec._4_4_ < 3;
              timeoutLength.tv_usec._4_4_ = timeoutLength.tv_usec._4_4_ + 1) {
            if ((-1 < cp->PipeReadEnds[timeoutLength.tv_usec._4_4_]) &&
               (iVar3 = cp->PipeReadEnds[timeoutLength.tv_usec._4_4_] / 0x40,
               (cp->PipeSet).__fds_bits[iVar3] =
                    1L << ((byte)((long)cp->PipeReadEnds[timeoutLength.tv_usec._4_4_] % 0x40) & 0x3f
                          ) | (cp->PipeSet).__fds_bits[iVar3],
               (int)timeout < cp->PipeReadEnds[timeoutLength.tv_usec._4_4_])) {
              timeout._0_4_ = cp->PipeReadEnds[timeoutLength.tv_usec._4_4_];
            }
          }
          if ((int)timeout < 0) {
            cp_local._4_4_ = 1;
          }
          else {
            do {
              iVar3 = select((int)timeout + 1,(fd_set *)&cp->PipeSet,(fd_set *)0x0,(fd_set *)0x0,
                             (timeval *)n);
              bVar4 = false;
              if (iVar3 < 0) {
                piVar2 = __errno_location();
                bVar4 = *piVar2 == 4;
              }
            } while (bVar4);
            if (iVar3 == 0) {
              wd->Expired = 1;
              cp_local._4_4_ = 1;
            }
            else {
              if (iVar3 < 0) {
                piVar2 = __errno_location();
                __src = strerror(*piVar2);
                strncpy(cp->ErrorMessage,__src,0x400);
                cmsysProcess_Kill(cp);
                cp->Killed = 0;
                cp->SelectError = 1;
              }
              cp_local._4_4_ = 0;
            }
          }
        }
        else {
          wd->Expired = 1;
          cp_local._4_4_ = 1;
        }
      }
      else {
        cp_local._4_4_ = 1;
      }
      return cp_local._4_4_;
    }
    if ((-1 < cp->PipeReadEnds[timeoutLength.tv_usec._4_4_]) &&
       (((cp->PipeSet).__fds_bits[cp->PipeReadEnds[timeoutLength.tv_usec._4_4_] / 0x40] &
        1L << ((byte)((long)cp->PipeReadEnds[timeoutLength.tv_usec._4_4_] % 0x40) & 0x3f)) != 0)) {
      iVar3 = cp->PipeReadEnds[timeoutLength.tv_usec._4_4_] / 0x40;
      (cp->PipeSet).__fds_bits[iVar3] =
           (1L << ((byte)((long)cp->PipeReadEnds[timeoutLength.tv_usec._4_4_] % 0x40) & 0x3f) ^
           0xffffffffffffffffU) & (cp->PipeSet).__fds_bits[iVar3];
      do {
        sVar1 = read(cp->PipeReadEnds[timeoutLength.tv_usec._4_4_],cp->PipeBuffer,0x400);
        bVar4 = false;
        if (sVar1 < 0) {
          piVar2 = __errno_location();
          bVar4 = *piVar2 == 4;
        }
      } while (bVar4);
      if (sVar1 < 1) {
        if ((-1 < sVar1) || (piVar2 = __errno_location(), *piVar2 != 0xb)) {
          kwsysProcessCleanupDescriptor(cp->PipeReadEnds + timeoutLength.tv_usec._4_4_);
          cp->PipesLeft = cp->PipesLeft + -1;
        }
      }
      else if (timeoutLength.tv_usec._4_4_ == 2) {
        kwsysProcessDestroy(cp);
      }
      else if ((data != (char **)0x0) && (length != (int *)0x0)) {
        *data = cp->PipeBuffer;
        iStack_60 = (int)sVar1;
        *length = iStack_60;
        if (timeoutLength.tv_usec._4_4_ == 0) {
          wd->PipeId = 2;
        }
        else if (timeoutLength.tv_usec._4_4_ == 1) {
          wd->PipeId = 3;
        }
        return 1;
      }
    }
    timeoutLength.tv_usec._4_4_ = timeoutLength.tv_usec._4_4_ + 1;
  } while( true );
}

Assistant:

static int kwsysProcessWaitForPipe(kwsysProcess* cp, char** data, int* length,
                                   kwsysProcessWaitData* wd)
{
  int i;
  kwsysProcessTimeNative timeoutLength;

#if KWSYSPE_USE_SELECT
  int numReady = 0;
  int max = -1;
  kwsysProcessTimeNative* timeout = 0;

  /* Check for any open pipes with data reported ready by the last
     call to select.  According to "man select_tut" we must deal
     with all descriptors reported by a call to select before
     passing them to another select call.  */
  for(i=0; i < KWSYSPE_PIPE_COUNT; ++i)
    {
    if(cp->PipeReadEnds[i] >= 0 &&
       FD_ISSET(cp->PipeReadEnds[i], &cp->PipeSet))
      {
      kwsysProcess_ssize_t n;

      /* We are handling this pipe now.  Remove it from the set.  */
      FD_CLR(cp->PipeReadEnds[i], &cp->PipeSet);

      /* The pipe is ready to read without blocking.  Keep trying to
         read until the operation is not interrupted.  */
      while(((n = read(cp->PipeReadEnds[i], cp->PipeBuffer,
                       KWSYSPE_PIPE_BUFFER_SIZE)) < 0) && (errno == EINTR));
      if(n > 0)
        {
        /* We have data on this pipe.  */
        if(i == KWSYSPE_PIPE_SIGNAL)
          {
          /* A child process has terminated.  */
          kwsysProcessDestroy(cp);
          }
        else if(data && length)
          {
          /* Report this data.  */
          *data = cp->PipeBuffer;
          *length = (int)(n);
          switch(i)
            {
            case KWSYSPE_PIPE_STDOUT:
              wd->PipeId = kwsysProcess_Pipe_STDOUT; break;
            case KWSYSPE_PIPE_STDERR:
              wd->PipeId = kwsysProcess_Pipe_STDERR; break;
            };
          return 1;
          }
        }
      else if(n < 0 && errno == EAGAIN)
        {
        /* No data are really ready.  The select call lied.  See the
           "man select" page on Linux for cases when this occurs.  */
        }
      else
        {
        /* We are done reading from this pipe.  */
        kwsysProcessCleanupDescriptor(&cp->PipeReadEnds[i]);
        --cp->PipesLeft;
        }
      }
    }

  /* If we have data, break early.  */
  if(wd->PipeId)
    {
    return 1;
    }

  /* Make sure the set is empty (it should always be empty here
     anyway).  */
  FD_ZERO(&cp->PipeSet);

  /* Setup a timeout if required.  */
  if(wd->TimeoutTime.tv_sec < 0)
    {
    timeout = 0;
    }
  else
    {
    timeout = &timeoutLength;
    }
  if(kwsysProcessGetTimeoutLeft(&wd->TimeoutTime,
                                wd->User?wd->UserTimeout:0,
                                &timeoutLength, 0))
    {
    /* Timeout has already expired.  */
    wd->Expired = 1;
    return 1;
    }

  /* Add the pipe reading ends that are still open.  */
  max = -1;
  for(i=0; i < KWSYSPE_PIPE_COUNT; ++i)
    {
    if(cp->PipeReadEnds[i] >= 0)
      {
      FD_SET(cp->PipeReadEnds[i], &cp->PipeSet);
      if(cp->PipeReadEnds[i] > max)
        {
        max = cp->PipeReadEnds[i];
        }
      }
    }

  /* Make sure we have a non-empty set.  */
  if(max < 0)
    {
    /* All pipes have closed.  Child has terminated.  */
    return 1;
    }

  /* Run select to block until data are available.  Repeat call
     until it is not interrupted.  */
  while(((numReady = select(max+1, &cp->PipeSet, 0, 0, timeout)) < 0) &&
        (errno == EINTR));

  /* Check result of select.  */
  if(numReady == 0)
    {
    /* Select's timeout expired.  */
    wd->Expired = 1;
    return 1;
    }
  else if(numReady < 0)
    {
    /* Select returned an error.  Leave the error description in the
       pipe buffer.  */
    strncpy(cp->ErrorMessage, strerror(errno), KWSYSPE_PIPE_BUFFER_SIZE);

    /* Kill the children now.  */
    kwsysProcess_Kill(cp);
    cp->Killed = 0;
    cp->SelectError = 1;
    }

  return 0;
#else
  /* Poll pipes for data since we do not have select.  */
  for(i=0; i < KWSYSPE_PIPE_COUNT; ++i)
    {
    if(cp->PipeReadEnds[i] >= 0)
      {
      const int fd = cp->PipeReadEnds[i];
      int n = read(fd, cp->PipeBuffer, KWSYSPE_PIPE_BUFFER_SIZE);
      if(n > 0)
        {
        /* We have data on this pipe.  */
        if(i == KWSYSPE_PIPE_SIGNAL)
          {
          /* A child process has terminated.  */
          kwsysProcessDestroy(cp);
          }
        else if(data && length)
          {
          /* Report this data.  */
          *data = cp->PipeBuffer;
          *length = n;
          switch(i)
            {
            case KWSYSPE_PIPE_STDOUT:
              wd->PipeId = kwsysProcess_Pipe_STDOUT; break;
            case KWSYSPE_PIPE_STDERR:
              wd->PipeId = kwsysProcess_Pipe_STDERR; break;
            };
          }
        return 1;
        }
      else if (n == 0)  /* EOF */
        {
        /* We are done reading from this pipe.  */
#if defined(__VMS)
        if(!cp->CommandsLeft)
#endif
          {
          kwsysProcessCleanupDescriptor(&cp->PipeReadEnds[i]);
          --cp->PipesLeft;
          }
        }
      else if (n < 0)  /* error */
        {
#if defined(__VMS)
        if(!cp->CommandsLeft)
          {
          kwsysProcessCleanupDescriptor(&cp->PipeReadEnds[i]);
          --cp->PipesLeft;
          }
        else
#endif
        if((errno != EINTR) && (errno != EAGAIN))
          {
          strncpy(cp->ErrorMessage,strerror(errno),
                  KWSYSPE_PIPE_BUFFER_SIZE);
          /* Kill the children now.  */
          kwsysProcess_Kill(cp);
          cp->Killed = 0;
          cp->SelectError = 1;
          return 1;
          }
        }
      }
    }

  /* If we have data, break early.  */
  if(wd->PipeId)
    {
    return 1;
    }

  if(kwsysProcessGetTimeoutLeft(&wd->TimeoutTime, wd->User?wd->UserTimeout:0,
                                &timeoutLength, 1))
    {
    /* Timeout has already expired.  */
    wd->Expired = 1;
    return 1;
    }

  /* Sleep a little, try again. */
  {
  unsigned int msec = ((timeoutLength.tv_sec * 1000) +
                       (timeoutLength.tv_usec / 1000));
  if (msec > 100000)
    {
    msec = 100000;  /* do not sleep more than 100 milliseconds at a time */
    }
  kwsysProcess_usleep(msec);
  }
  return 0;
#endif
}